

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

int __thiscall luna::Function::AddConstValue(Function *this,Value *v)

{
  iterator __position;
  ValueT VVar1;
  undefined4 uVar2;
  pointer pVVar3;
  
  __position._M_current =
       (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<luna::Value,std::allocator<luna::Value>>::_M_realloc_insert<luna::Value_const&>
              ((vector<luna::Value,std::allocator<luna::Value>> *)&this->const_values_,__position,v)
    ;
    pVVar3 = (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    VVar1 = v->type_;
    uVar2 = *(undefined4 *)&v->field_0xc;
    (__position._M_current)->field_0 = v->field_0;
    (__position._M_current)->type_ = VVar1;
    *(undefined4 *)&(__position._M_current)->field_0xc = uVar2;
    pVVar3 = (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  return (int)((ulong)((long)pVVar3 -
                      (long)(this->const_values_).
                            super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddConstValue(const Value &v)
    {
        const_values_.push_back(v);
        return const_values_.size() - 1;
    }